

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_lantern_handling.hpp
# Opt level: O0

uint32_t PatchImproveLanternHandling::inject_func_dim_palettes(ROM *rom,uint32_t func_and_words)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  uint32_t uVar1;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<md::AddressRegister> local_1c1;
  AddressRegister local_1c0;
  iterator local_1b0;
  size_type local_1a8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_1a0;
  allocator<md::DataRegister> local_181;
  DataRegister local_180;
  iterator local_170;
  size_type local_168;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_160;
  DataRegister local_148;
  AddressRegister local_138;
  DataRegister local_128;
  allocator<md::AddressRegister> local_111;
  AddressRegister local_110;
  iterator local_100;
  size_type local_f8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f0;
  allocator<md::DataRegister> local_d5 [13];
  DataRegister local_c8;
  iterator local_b8;
  size_type local_b0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_a8;
  undefined1 local_90 [8];
  Code func;
  uint32_t func_and_words_local;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = func_and_words;
  md::Code::Code((Code *)local_90);
  md::DataRegister::DataRegister(&local_c8,'\x01');
  local_b8 = &local_c8;
  local_b0 = 1;
  std::allocator<md::DataRegister>::allocator(local_d5);
  __l_02._M_len = local_b0;
  __l_02._M_array = local_b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_a8,__l_02,local_d5);
  md::AddressRegister::AddressRegister(&local_110,'\0');
  local_100 = &local_110;
  local_f8 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_111);
  __l_01._M_len = local_f8;
  __l_01._M_array = local_100;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f0,__l_01,&local_111);
  md::Code::movem_to_stack((Code *)local_90,&local_a8,&local_f0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_f0);
  std::allocator<md::AddressRegister>::~allocator(&local_111);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_a8);
  std::allocator<md::DataRegister>::~allocator(local_d5);
  md::DataRegister::DataRegister(&local_128,'\0');
  md::Code::movew((Code *)local_90,0xccc,(Param *)&local_128);
  md::AddressRegister::AddressRegister(&local_138,'\0');
  md::Code::lea((Code *)local_90,0xff0080,&local_138);
  md::DataRegister::DataRegister(&local_148,'\x01');
  md::Code::movew((Code *)local_90,0x10,(Param *)&local_148);
  md::Code::jsr((Code *)local_90,func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               );
  md::DataRegister::DataRegister(&local_180,'\x01');
  local_170 = &local_180;
  local_168 = 1;
  std::allocator<md::DataRegister>::allocator(&local_181);
  __l_00._M_len = local_168;
  __l_00._M_array = local_170;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_160,__l_00,&local_181);
  md::AddressRegister::AddressRegister(&local_1c0,'\0');
  local_1b0 = &local_1c0;
  local_1a8 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_1c1);
  __l._M_len = local_1a8;
  __l._M_array = local_1b0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_1a0,__l,&local_1c1);
  md::Code::movem_from_stack((Code *)local_90,&local_160,&local_1a0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_1a0);
  std::allocator<md::AddressRegister>::~allocator(&local_1c1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_160);
  std::allocator<md::DataRegister>::~allocator(&local_181);
  md::Code::rts((Code *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_90,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

static uint32_t inject_func_dim_palettes(md::ROM& rom, uint32_t func_and_words)
    {
        // Darken palettes with AND filter contained in D0
        md::Code func;
        func.movem_to_stack({ reg_D1 }, { reg_A0 });
        {
            // Slightly dim palette 0
            func.movew(0x0CCC, reg_D0);
            func.lea(0xFF0080, reg_A0);
            func.movew(16, reg_D1);
            func.jsr(func_and_words);
        }
        func.movem_from_stack({ reg_D1 }, { reg_A0 });
        func.rts();
        return rom.inject_code(func);
    }